

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int modified_get_undeliverable_here(MODIFIED_HANDLE modified,_Bool *undeliverable_here_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  uint local_1c;
  
  if (modified == (MODIFIED_HANDLE)0x0) {
    iVar3 = 0x47b7;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(modified->composite_value,&local_1c);
    iVar3 = 0x47bf;
    if ((iVar1 == 0) && (iVar3 = 0x47c5, 1 < local_1c)) {
      value = amqpvalue_get_composite_item_in_place(modified->composite_value,1);
      iVar3 = 0x47cd;
      if ((value != (AMQP_VALUE)0x0) && (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)
         ) {
        iVar1 = amqpvalue_get_boolean(value,undeliverable_here_value);
        iVar3 = 0x47d4;
        if (iVar1 == 0) {
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int modified_get_undeliverable_here(MODIFIED_HANDLE modified, bool* undeliverable_here_value)
{
    int result;

    if (modified == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        MODIFIED_INSTANCE* modified_instance = (MODIFIED_INSTANCE*)modified;
        if (amqpvalue_get_composite_item_count(modified_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 1)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(modified_instance->composite_value, 1);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_boolean(item_value, undeliverable_here_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}